

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# neural_net.cpp
# Opt level: O3

void __thiscall Net::fit(Net *this,Table *samp,Table *ans,int global_iterations,int shott)

{
  Table *this_00;
  pointer pvVar1;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> __first;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> __last;
  undefined1 auVar2 [16];
  int iVar3;
  int iVar4;
  size_t __i;
  long lVar5;
  ulong uVar6;
  long lVar7;
  char *pcVar8;
  double dVar9;
  double dVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  mt19937 rnd;
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  local_13b8;
  
  this->shot = shott;
  local_13b8._M_x[0] = 0x4b;
  lVar5 = 1;
  uVar6 = 0x4b;
  do {
    uVar6 = (ulong)(((uint)(uVar6 >> 0x1e) ^ (uint)uVar6) * 0x6c078965 + (int)lVar5);
    local_13b8._M_x[lVar5] = uVar6;
    lVar5 = lVar5 + 1;
  } while (lVar5 != 0x270);
  local_13b8._M_p = 0x270;
  iVar3 = Table::get_cols(ans);
  if (iVar3 == 1) {
    iVar3 = Table::get_cols(samp);
    pvVar1 = (this->mesh).
             super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((long)*(pointer *)
               ((long)&(pvVar1->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                       super__Vector_impl_data + 8) -
        *(long *)&(pvVar1->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                  super__Vector_impl_data >> 3 == (long)iVar3) {
      dVar9 = Table::get_max(ans,0);
      dVar10 = Table::get_min(ans,0);
      pvVar1 = (this->mesh).
               super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      if ((int)((dVar9 - dVar10) + 1.0) ==
          (int)((ulong)((long)pvVar1[-1].super__Vector_base<double,_std::allocator<double>_>._M_impl
                              .super__Vector_impl_data._M_finish -
                       (long)pvVar1[-1].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                             super__Vector_impl_data._M_start) >> 3)) {
        this_00 = &this->samples;
        iVar3 = samp->rows;
        (this->samples).cols = samp->cols;
        (this->samples).rows = iVar3;
        std::
        vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Table::types,_int>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Table::types,_int>_>_>
        ::operator=(&(this->samples).columns,&samp->columns);
        std::
        vector<std::pair<int,_std::vector<long_long,_std::allocator<long_long>_>_>,_std::allocator<std::pair<int,_std::vector<long_long,_std::allocator<long_long>_>_>_>_>
        ::operator=(&(this->samples).int_cols,&samp->int_cols);
        std::
        vector<std::pair<int,_std::vector<double,_std::allocator<double>_>_>,_std::allocator<std::pair<int,_std::vector<double,_std::allocator<double>_>_>_>_>
        ::operator=(&(this->samples).float_cols,&samp->float_cols);
        std::
        vector<std::pair<int,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::pair<int,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
        ::operator=(&(this->samples).string_cols,&samp->string_cols);
        iVar3 = ans->rows;
        (this->answers).cols = ans->cols;
        (this->answers).rows = iVar3;
        std::
        vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Table::types,_int>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Table::types,_int>_>_>
        ::operator=(&(this->answers).columns,&ans->columns);
        std::
        vector<std::pair<int,_std::vector<long_long,_std::allocator<long_long>_>_>,_std::allocator<std::pair<int,_std::vector<long_long,_std::allocator<long_long>_>_>_>_>
        ::operator=(&(this->answers).int_cols,&ans->int_cols);
        std::
        vector<std::pair<int,_std::vector<double,_std::allocator<double>_>_>,_std::allocator<std::pair<int,_std::vector<double,_std::allocator<double>_>_>_>_>
        ::operator=(&(this->answers).float_cols,&ans->float_cols);
        std::
        vector<std::pair<int,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::pair<int,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
        ::operator=(&(this->answers).string_cols,&ans->string_cols);
        iVar3 = Table::get_cols(this_00);
        if (0 < iVar3) {
          iVar3 = 0;
          do {
            dVar9 = Table::get_max(this_00,iVar3);
            if (dVar9 <= 1.0) {
              dVar9 = 1.0;
            }
            Table::divide_column(this_00,iVar3,dVar9);
            iVar3 = iVar3 + 1;
            iVar4 = Table::get_cols(this_00);
          } while (iVar3 < iVar4);
        }
        iVar3 = Table::get_rows(this_00);
        std::vector<int,_std::allocator<int>_>::resize(&this->shuffler,(long)iVar3);
        auVar2 = _DAT_0010c260;
        __first._M_current =
             (this->shuffler).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
        __last._M_current =
             (this->shuffler).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_finish;
        lVar5 = (long)__last._M_current - (long)__first._M_current;
        if (lVar5 != 0) {
          lVar5 = lVar5 >> 2;
          lVar5 = lVar5 + (ulong)(lVar5 == 0);
          lVar7 = lVar5 + -1;
          auVar11._8_4_ = (int)lVar7;
          auVar11._0_8_ = lVar7;
          auVar11._12_4_ = (int)((ulong)lVar7 >> 0x20);
          uVar6 = 0;
          auVar11 = auVar11 ^ _DAT_0010c260;
          auVar12 = _DAT_0010c250;
          do {
            auVar13 = auVar12 ^ auVar2;
            if ((bool)(~(auVar13._4_4_ == auVar11._4_4_ && auVar11._0_4_ < auVar13._0_4_ ||
                        auVar11._4_4_ < auVar13._4_4_) & 1)) {
              __first._M_current[uVar6] = (int)uVar6;
            }
            if ((auVar13._12_4_ != auVar11._12_4_ || auVar13._8_4_ <= auVar11._8_4_) &&
                auVar13._12_4_ <= auVar11._12_4_) {
              __first._M_current[uVar6 + 1] = (int)uVar6 + 1;
            }
            uVar6 = uVar6 + 2;
            lVar7 = auVar12._8_8_;
            auVar12._0_8_ = auVar12._0_8_ + 2;
            auVar12._8_8_ = lVar7 + 2;
          } while ((lVar5 + 1U & 0xfffffffffffffffe) != uVar6);
        }
        std::
        shuffle<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,std::mersenne_twister_engine<unsigned_long,32ul,624ul,397ul,31ul,2567483615ul,11ul,4294967295ul,7ul,2636928640ul,15ul,4022730752ul,18ul,1812433253ul>&>
                  (__first,__last,&local_13b8);
        if (this->shot == 0) {
          dVar9 = log((double)(int)((ulong)((long)(this->shuffler).
                                                  super__Vector_base<int,_std::allocator<int>_>.
                                                  _M_impl.super__Vector_impl_data._M_finish -
                                           (long)(this->shuffler).
                                                 super__Vector_base<int,_std::allocator<int>_>.
                                                 _M_impl.super__Vector_impl_data._M_start) >> 2));
          iVar3 = 2;
          if (2 < (int)dVar9 / 10) {
            iVar3 = (int)dVar9 / 10;
          }
          this->shot = iVar3;
        }
        learn(this,global_iterations);
        return;
      }
      pcVar8 = "Incorrect output data\n";
    }
    else {
      pcVar8 = "Incorrect input data\n";
    }
  }
  else {
    pcVar8 = "Output table has more than 1 column\n";
  }
  std::operator<<((ostream *)&std::cerr,pcVar8);
  exit(1);
}

Assistant:

void Net::fit(Table &samp, Table &ans, int global_iterations, int shott){
    shot = shott;
    std::mt19937 rnd(75);
    if (ans.get_cols() != 1){
        std::cerr << "Output table has more than 1 column\n";
        exit(EXIT_FAILURE);
    }
    if (samp.get_cols() != mesh[0].size()){
        std::cerr << "Incorrect input data\n";
        exit(EXIT_FAILURE);
    }
    if ((int)(ans.get_max(0)-ans.get_min(0) + 1) != (int)mesh.back().size()){
        std::cerr << "Incorrect output data\n";
        exit(EXIT_FAILURE);
    }

    samples = samp;
    answers = ans;
    for (int i = 0; i < samples.get_cols(); ++i)
        samples.divide_column(i, std::max(1.0, samples.get_max(i)));

    // creating shuffler
    shuffler.resize(samples.get_rows());
    for (int i = 0; i < shuffler.size(); ++i)
        shuffler[i] = i;
    std::shuffle(shuffler.begin(), shuffler.end(), rnd);
    if (shot == 0) shot = std::max((int)log((int)shuffler.size())/10, 2);
    learn(global_iterations);
}